

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O3

void makeInput(int id,string *str)

{
  Value *pVVar1;
  Value *this;
  Value *pVVar2;
  size_t in_RCX;
  int iVar3;
  Value input;
  FastWriter writer;
  ofstream fin;
  undefined1 local_2f8 [72];
  FastWriter local_2b0;
  Value local_280;
  Value local_258;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)str,_S_out);
  Json::FastWriter::FastWriter(&local_2b0);
  Json::Value::Value((Value *)(local_2f8 + 0x20),nullValue);
  pVVar1 = Json::Value::operator[]((Value *)(local_2f8 + 0x20),"requests");
  this = Json::Value::operator[]((Value *)(local_2f8 + 0x20),"responses");
  if (0 < turnID) {
    iVar3 = 0;
    do {
      pVVar2 = Json::Value::operator[](&logger,iVar3);
      pVVar2 = Json::Value::operator[](pVVar2,id);
      Json::Value::Value(&local_258,pVVar2);
      pVVar2 = Json::Value::operator[](pVVar1,iVar3);
      Json::Value::operator=(pVVar2,&local_258);
      Json::Value::~Value(&local_258);
      iVar3 = iVar3 + 1;
    } while (iVar3 < turnID);
    if (1 < turnID) {
      iVar3 = 1;
      do {
        pVVar1 = Json::Value::operator[](&logger,iVar3);
        pVVar1 = Json::Value::operator[](pVVar1,1 - id);
        Json::Value::Value(&local_280,pVVar1);
        pVVar1 = Json::Value::operator[](this,iVar3 + -1);
        Json::Value::operator=(pVVar1,&local_280);
        Json::Value::~Value(&local_280);
        iVar3 = iVar3 + 1;
      } while (iVar3 < turnID);
    }
  }
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)local_2f8,(int)&local_2b0,local_2f8 + 0x20,in_RCX);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,(char *)local_2f8._0_8_,local_2f8._8_8_);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_);
  }
  std::ofstream::close();
  Json::Value::~Value((Value *)(local_2f8 + 0x20));
  Json::FastWriter::~FastWriter(&local_2b0);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void makeInput(int id, string str)
{
    ofstream fin(str);
    Json::FastWriter writer;
    Json::Value input;
    Json::Value &req = input["requests"];
    Json::Value &res = input["responses"];
    for (int i = 1; i <= turnID; ++i)
        req[i - 1] = logger[i - 1][id];
    for (int i = 1; i < turnID; ++i)
        res[i - 1] = logger[i][1 - id];
    fin << writer.write(input);
    fin.close();
}